

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

void CTcPrsNode::s_gen_member_rhs
               (int discard,CTcPrsNode *prop_expr,int prop_is_expr,int argc,int varargs,
               CTcNamedArgs *named_args)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined8 in_RAX;
  undefined4 in_register_0000000c;
  size_t __n;
  undefined4 in_register_00000014;
  CTcGenTarg *pCVar4;
  undefined8 uStack_38;
  
  __n = CONCAT44(in_register_0000000c,argc);
  if (((~G_cg->field_0xd0 & 0x18) == 0) &&
     ((argc != 0 || ((named_args != (CTcNamedArgs *)0x0 && (named_args->cnt != 0)))))) {
    err_throw(0x9c5);
  }
  uStack_38 = in_RAX;
  uVar3 = (*(prop_expr->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x19])
                    (prop_expr,0,CONCAT44(in_register_00000014,prop_is_expr));
  pCVar4 = G_cg;
  if ((vm_prop_id_t)uVar3 == 0) {
    if ((~G_cg->field_0xd0 & 0x18) == 0) {
      CTcGenTarg::write_op(G_cg,'i');
    }
    else {
      if (varargs != 0) {
        CTcGenTarg::write_op(G_cg,0x8d);
        CTcGenTarg::write_op(G_cg,'v');
      }
      CTcGenTarg::write_op(G_cg,'b');
      uStack_38 = CONCAT17((char)argc,(undefined7)uStack_38);
      pCVar4 = (CTcGenTarg *)G_cs;
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&uStack_38 + 7,(void *)0x1,__n);
    }
    G_cg->sp_depth_ = (G_cg->sp_depth_ - argc) + -2;
  }
  else if (argc == 0) {
    CTcGenTarg::write_op(G_cg,((~G_cg->field_0xd0 & 0x18) == 0) * '\b' + '`');
    pCVar4 = (CTcGenTarg *)G_cs;
    CTcDataStream::write_prop_id(&G_cs->super_CTcDataStream,uVar3 & 0xffff);
    G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
  }
  else {
    CTcGenTarg::write_callprop(G_cg,argc,varargs,(vm_prop_id_t)uVar3);
  }
  CTcGenTarg::post_call_cleanup(pCVar4,named_args);
  if (discard == 0) {
    CTcGenTarg::write_op(G_cg,0x8b);
    pCVar4 = G_cg;
    iVar2 = G_cg->sp_depth_;
    iVar1 = iVar2 + 1;
    G_cg->sp_depth_ = iVar1;
    if (pCVar4->max_sp_depth_ <= iVar2) {
      pCVar4->max_sp_depth_ = iVar1;
    }
  }
  return;
}

Assistant:

void CTcPrsNode::s_gen_member_rhs(int discard,
                                  CTcPrsNode *prop_expr, int prop_is_expr,
                                  int argc, int varargs,
                                  CTcNamedArgs *named_args)
{
    vm_prop_id_t prop;

    /* we can't call methods with arguments in speculative mode */
    if (G_cg->is_speculative()
        && (argc != 0 || (named_args != 0 && named_args->cnt != 0)))
        err_throw(VMERR_BAD_SPEC_EVAL);

    /* get or generate the property ID value */
    prop = prop_expr->gen_code_propid(FALSE, prop_is_expr);

    /* 
     *   if we got a property ID, generate a simple GETPROP or CALLPROP
     *   instruction; otherwise, generate a PTRCALLPROP instruction
     */
    if (prop != VM_INVALID_PROP)
    {
        /* 
         *   we have a constant property ID - generate a GETPROP or
         *   CALLPROP with the property ID as constant data 
         */
        if (argc == 0)
        {
            /* no arguments - generate a GETPROP */
            G_cg->write_op(G_cg->is_speculative()
                           ? OPC_GETPROPDATA : OPC_GETPROP);
            G_cs->write_prop_id(prop);

            /* this pops an object element */
            G_cg->note_pop();
        }
        else
        {
            /* write the CALLPROP instruction */
            G_cg->write_callprop(argc, varargs, prop);
        }
    }
    else
    {
        if (G_cg->is_speculative())
        {
            /* 
             *   speculative - use PTRGETPROPDATA to ensure we don't cause
             *   any side effects 
             */
            G_cg->write_op(OPC_PTRGETPROPDATA);
        }
        else
        {
            /* 
             *   if we have a varargs list, modify the call instruction
             *   that follows to make it a varargs call 
             */
            if (varargs)
            {
                /* swap to get the arg counter back on top */
                G_cg->write_op(OPC_SWAP);
                
                /* write the varargs modifier */
                G_cg->write_op(OPC_VARARGC);
            }

            /* a property pointer is on the stack - write a PTRCALLPROP */
            G_cg->write_op(OPC_PTRCALLPROP);
            G_cs->write((int)argc);
        }

        /* 
         *   ptrcallprop/ptrgetpropdata removes arguments, the object, and
         *   the property 
         */
        G_cg->note_pop(argc + 2);
    }

    /* do post-call cleanup: named arg removal, etc */
    G_cg->post_call_cleanup(named_args);

    /* if we're not discarding the result, push it from R0 */
    if (!discard)
    {
        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();
    }
}